

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_string.hpp
# Opt level: O2

string * iutest::detail::StringRemoveComment(string *__return_storage_ptr__,string *str)

{
  long lVar1;
  long lVar2;
  long lVar3;
  string local_50 [32];
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  lVar1 = std::__cxx11::string::find((char)str,10);
  lVar2 = 0;
  while (lVar1 != -1) {
    lVar3 = lVar1 + 1;
    if ((str->_M_dataplus)._M_p[lVar2] != '#') {
      std::__cxx11::string::substr((ulong)local_50,(ulong)str);
      std::__cxx11::string::append((string *)__return_storage_ptr__);
      std::__cxx11::string::~string(local_50);
    }
    lVar1 = std::__cxx11::string::find((char)str,10);
    lVar2 = lVar3;
  }
  if ((str->_M_dataplus)._M_p[lVar2] != '#') {
    std::__cxx11::string::substr((ulong)local_50,(ulong)str);
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string(local_50);
  }
  return __return_storage_ptr__;
}

Assistant:

inline ::std::string StringRemoveComment(const ::std::string& str)
{
    ::std::string r;
    ::std::string::size_type prev = 0;
    ::std::string::size_type pos = str.find('\n', 0);
    while( pos != ::std::string::npos )
    {
        ++pos;
        if( str[prev] != '#' ) {
            r += str.substr(prev, pos-prev);
        }
        prev = pos;
        pos = str.find('\n', pos);
    }
    if( str[prev] != '#' ) {
        r += str.substr(prev);
    }
    return r;
}